

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusStationary.cpp
# Opt level: O0

double __thiscall
PerseusStationary::GetQ
          (PerseusStationary *this,JointBeliefInterface *b,Index jaI,BGPolicyIndex *betaMaxI)

{
  long lVar1;
  uint uVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  BGPolicyIndex BVar5;
  vector<double,_std::allocator<double>_> *pvVar6;
  BGPolicyIndex *in_RCX;
  uint in_EDX;
  long *in_RSI;
  long in_RDI;
  double dVar7;
  ValueFunctionPOMDPDiscrete *in_stack_00000028;
  BeliefInterface *in_stack_00000030;
  Index maxI;
  
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::operator[]((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                *)(in_RDI + 0xa8),(ulong)in_EDX);
  uVar2 = BeliefValue::GetMaximizingVectorIndex(in_stack_00000030,in_stack_00000028);
  pvVar3 = std::
           vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
           ::operator[]((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                         *)(in_RDI + 0xa8),(ulong)in_EDX);
  pvVar4 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::operator[](pvVar3,(ulong)uVar2);
  BVar5 = AlphaVector::GetBetaI(pvVar4);
  *in_RCX = BVar5;
  lVar1 = *(long *)(*in_RSI + -0xb8);
  pvVar3 = std::
           vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
           ::operator[]((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                         *)(in_RDI + 0xa8),(ulong)in_EDX);
  pvVar4 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::operator[](pvVar3,(ulong)uVar2);
  pvVar6 = AlphaVector::GetValues(pvVar4);
  dVar7 = (double)(**(code **)(*(long *)((long)in_RSI + lVar1) + 0x80))((long)in_RSI + lVar1,pvVar6)
  ;
  return dVar7;
}

Assistant:

double PerseusStationary::GetQ(const JointBeliefInterface &b, Index jaI,
                               AlphaVector::BGPolicyIndex &betaMaxI) const
{
    Index maxI=BeliefValue::
        GetMaximizingVectorIndex(b,_m_qFunction[jaI]);
    betaMaxI=_m_qFunction[jaI][maxI].GetBetaI();
    return(b.InnerProduct(_m_qFunction[jaI][maxI].GetValues()));
}